

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O0

Vec_Int_t * Abc_ManExpandCex(Gia_Man_t *pGia,Vec_Int_t *vCex)

{
  int iVar1;
  Vec_Int_t *p;
  bool bVar2;
  int local_30;
  int local_2c;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCexNew;
  Vec_Int_t *vCex_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Vec_IntSize(vCex);
  p = Vec_IntAlloc(iVar1);
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(pGia);
    bVar2 = false;
    if (local_2c < iVar1) {
      iVar1 = Gia_ManPiNum(pGia);
      _k = Gia_ManCi(pGia,iVar1 + local_2c);
      bVar2 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    Vec_IntPush(p,0);
    local_2c = local_2c + 1;
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pGia);
  local_30 = Gia_ManRegNum(pGia);
  do {
    local_2c = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(pGia);
      bVar2 = false;
      if (local_2c < iVar1) {
        _k = Gia_ManCi(pGia,local_2c);
        bVar2 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar2) break;
      iVar1 = Gia_ObjRefNum(pGia,_k);
      if (iVar1 == 0) {
        Vec_IntPush(p,0);
      }
      else {
        iVar1 = Vec_IntSize(vCex);
        if (local_30 == iVar1) break;
        iVar1 = Vec_IntEntry(vCex,local_30);
        Vec_IntPush(p,iVar1);
        local_30 = local_30 + 1;
      }
      local_2c = local_2c + 1;
    }
    iVar1 = Vec_IntSize(vCex);
    if (local_30 == iVar1) {
      return p;
    }
  } while( true );
}

Assistant:

Vec_Int_t * Abc_ManExpandCex( Gia_Man_t * pGia, Vec_Int_t * vCex )
{
    Vec_Int_t * vCexNew;
    Gia_Obj_t * pObj;
    int i, k;

    // start with register outputs
    vCexNew = Vec_IntAlloc( Vec_IntSize(vCex) );
    Gia_ManForEachRo( pGia, pObj, i )
        Vec_IntPush( vCexNew, 0 );

    ABC_FREE( pGia->pRefs );
    Gia_ManCreateRefs( pGia );
    k = Gia_ManRegNum( pGia );
    while ( 1 )
    {
        Gia_ManForEachPi( pGia, pObj, i )
        {
            if ( Gia_ObjRefNum(pGia, pObj) == 0 )
                Vec_IntPush( vCexNew, 0 );
            else
            {
                if ( k == Vec_IntSize(vCex) )
                    break;
                Vec_IntPush( vCexNew, Vec_IntEntry(vCex, k++) );
            }
        }
        if ( k == Vec_IntSize(vCex) )
            break;
    }
    return vCexNew;
}